

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O3

void jpeg_fdct_4x8(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  uint uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  uint uVar18;
  uint uVar19;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar95;
  uint uVar29;
  int iVar31;
  undefined1 auVar28 [16];
  int iVar96;
  ulong uVar32;
  undefined1 auVar33 [16];
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  undefined1 auVar37 [16];
  ulong uVar38;
  int iVar97;
  ulong uVar39;
  undefined1 auVar40 [16];
  ulong uVar42;
  undefined1 auVar41 [16];
  ulong uVar44;
  undefined1 auVar45 [16];
  ulong uVar47;
  undefined1 auVar46 [16];
  long lVar49;
  undefined1 auVar50 [16];
  int iVar98;
  ulong uVar52;
  long lVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ulong uVar57;
  long lVar58;
  uint uVar59;
  uint uVar60;
  int iVar63;
  ulong uVar61;
  long lVar62;
  uint uVar64;
  int iVar67;
  ulong uVar65;
  long lVar66;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar99;
  long lVar71;
  ulong uVar72;
  long lVar73;
  undefined1 auVar74 [16];
  long lVar75;
  ulong uVar76;
  long lVar77;
  long lVar78;
  ulong uVar79;
  undefined1 auVar80 [16];
  long lVar82;
  ulong uVar83;
  undefined1 auVar81 [16];
  uint uVar84;
  int iVar87;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  uint uVar88;
  int iVar91;
  ulong uVar89;
  uint uVar92;
  int iVar94;
  ulong uVar93;
  undefined1 auVar90 [16];
  undefined8 local_d8;
  undefined8 local_b8;
  undefined8 local_a8;
  ulong uVar30;
  ulong uVar43;
  ulong uVar48;
  ulong uVar51;
  ulong uVar56;
  ulong uVar70;
  
  lVar10 = 0;
  memset(data,0,0x100);
  uVar32 = (ulong)start_col;
  do {
    lVar5 = *(long *)((long)sample_data + lVar10);
    bVar1 = *(byte *)(lVar5 + 3 + uVar32);
    iVar8 = (uint)*(byte *)(lVar5 + uVar32) + (uint)bVar1;
    bVar2 = *(byte *)(lVar5 + 1 + uVar32);
    bVar3 = *(byte *)(lVar5 + 2 + uVar32);
    iVar9 = (uint)bVar2 + (uint)bVar3;
    lVar6 = (ulong)*(byte *)(lVar5 + uVar32) - (ulong)bVar1;
    lVar5 = (ulong)bVar2 - (ulong)bVar3;
    data[lVar10] = (iVar9 + iVar8) * 8 + -0x1000;
    data[lVar10 + 2] = (iVar8 - iVar9) * 8;
    lVar7 = (lVar5 + lVar6) * 0x1151;
    data[lVar10 + 1] = (DCTELEM)(lVar6 * 0x187e + lVar7 + 0x200U >> 10);
    data[lVar10 + 3] = (DCTELEM)(lVar5 * 0x3ffffffc4df + lVar7 + 0x200U >> 10);
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x40);
  iVar97 = data[0x38] + *data;
  auVar40._4_4_ = data[0x39] + data[1];
  iVar8 = data[0x3a] + data[2];
  iVar9 = data[0x3b] + data[3];
  auVar45._4_4_ = iVar9;
  auVar45._0_4_ = iVar8;
  auVar40._8_4_ = auVar40._4_4_;
  auVar40._12_4_ = -(uint)(auVar40._4_4_ < 0);
  lVar71 = CONCAT44(-(uint)(iVar97 < 0),iVar97);
  auVar45._8_4_ = iVar9;
  auVar45._12_4_ = -(uint)(iVar9 < 0);
  lVar75 = CONCAT44(-(uint)(iVar8 < 0),iVar8);
  iVar96 = data[0x30] + data[8];
  auVar33._4_4_ = data[0x31] + data[9];
  iVar8 = data[0x32] + data[10];
  iVar9 = data[0x33] + data[0xb];
  auVar37._4_4_ = iVar9;
  auVar37._0_4_ = iVar8;
  auVar37._8_4_ = iVar9;
  auVar37._12_4_ = -(uint)(iVar9 < 0);
  lVar78 = CONCAT44(-(uint)(iVar8 < 0),iVar8);
  auVar33._8_4_ = auVar33._4_4_;
  auVar33._12_4_ = -(uint)(auVar33._4_4_ < 0);
  lVar36 = CONCAT44(-(uint)(iVar96 < 0),iVar96);
  iVar98 = data[0x28] + data[0x10];
  auVar54._4_4_ = data[0x29] + data[0x11];
  iVar8 = data[0x2a] + data[0x12];
  iVar9 = data[0x2b] + data[0x13];
  auVar80._4_4_ = iVar9;
  auVar80._0_4_ = iVar8;
  auVar80._8_4_ = iVar9;
  auVar80._12_4_ = -(uint)(iVar9 < 0);
  lVar53 = CONCAT44(-(uint)(iVar8 < 0),iVar8);
  auVar54._8_4_ = auVar54._4_4_;
  auVar54._12_4_ = -(uint)(auVar54._4_4_ < 0);
  lVar49 = CONCAT44(-(uint)(iVar98 < 0),iVar98);
  iVar99 = data[0x20] + data[0x18];
  auVar74._4_4_ = data[0x21] + data[0x19];
  iVar8 = data[0x22] + data[0x1a];
  iVar9 = data[0x23] + data[0x1b];
  auVar85._4_4_ = iVar9;
  auVar85._0_4_ = iVar8;
  auVar74._8_4_ = auVar74._4_4_;
  auVar74._12_4_ = -(uint)(auVar74._4_4_ < 0);
  lVar82 = CONCAT44(-(uint)(iVar99 < 0),iVar99);
  auVar85._8_4_ = iVar9;
  auVar85._12_4_ = -(uint)(iVar9 < 0);
  lVar58 = CONCAT44(-(uint)(iVar8 < 0),iVar8);
  lVar6 = lVar71 + lVar82 + 2;
  lVar7 = auVar40._8_8_ + auVar74._8_8_ + 2;
  lVar10 = lVar75 + lVar58 + 2;
  lVar5 = auVar45._8_8_ + auVar85._8_8_ + 2;
  uVar44 = lVar75 - lVar58;
  uVar47 = auVar45._8_8_ - auVar85._8_8_;
  uVar39 = lVar71 - lVar82;
  uVar42 = auVar40._8_8_ - auVar74._8_8_;
  lVar71 = lVar53 + lVar78;
  lVar75 = auVar80._8_8_ + auVar37._8_8_;
  uVar35 = lVar78 - lVar53;
  uVar38 = auVar37._8_8_ - auVar80._8_8_;
  lVar78 = lVar49 + lVar36;
  lVar82 = auVar54._8_8_ + auVar33._8_8_;
  uVar32 = lVar36 - lVar49;
  uVar34 = auVar33._8_8_ - auVar54._8_8_;
  uVar95 = *data - data[0x38];
  auVar28._4_4_ = data[1] - data[0x39];
  uVar29 = data[2] - data[0x3a];
  iVar31 = data[3] - data[0x3b];
  auVar55._4_4_ = iVar31;
  auVar55._0_4_ = uVar29;
  uVar59 = data[8] - data[0x30];
  iVar9 = data[9] - data[0x31];
  auVar20._4_4_ = iVar9;
  auVar20._0_4_ = uVar59;
  uVar64 = data[10] - data[0x32];
  iVar67 = data[0xb] - data[0x33];
  uVar18 = -(uint)((int)uVar29 < 0);
  iVar24 = -(uint)(iVar31 < 0);
  local_d8 = CONCAT44(iVar24,uVar18);
  auVar55._8_4_ = iVar31;
  auVar55._12_4_ = iVar24;
  uVar56 = auVar55._8_8_;
  uVar19 = data[0x10] - data[0x28];
  iVar25 = data[0x11] - data[0x29];
  uVar26 = data[0x12] - data[0x2a];
  iVar27 = data[0x13] - data[0x2b];
  uVar88 = data[0x18] - data[0x20];
  iVar91 = data[0x19] - data[0x21];
  auVar14._4_4_ = iVar91;
  auVar14._0_4_ = uVar88;
  uVar92 = data[0x1a] - data[0x22];
  iVar94 = data[0x1b] - data[0x23];
  uVar84 = -(uint)((int)uVar95 < 0);
  iVar87 = -(uint)(auVar28._4_4_ < 0);
  auVar28._8_4_ = auVar28._4_4_;
  auVar28._12_4_ = iVar87;
  uVar30 = auVar28._8_8_;
  *data = (DCTELEM)((ulong)(lVar6 + lVar78) >> 2);
  data[1] = (DCTELEM)((ulong)(lVar7 + lVar82) >> 2);
  data[2] = (DCTELEM)((ulong)(lVar10 + lVar71) >> 2);
  data[3] = (DCTELEM)((ulong)(lVar5 + lVar75) >> 2);
  data[0x20] = (DCTELEM)((ulong)(lVar6 - lVar78) >> 2);
  data[0x21] = (DCTELEM)((ulong)(lVar7 - lVar82) >> 2);
  data[0x22] = (DCTELEM)((ulong)(lVar10 - lVar71) >> 2);
  data[0x23] = (DCTELEM)((ulong)(lVar5 - lVar75) >> 2);
  lVar6 = (uVar39 + uVar32 & 0xffffffff) * 0x1151 + 0x4000 +
          ((uVar39 + uVar32 >> 0x20) * 0x1151 << 0x20);
  lVar7 = (uVar42 + uVar34 & 0xffffffff) * 0x1151 + 0x4000 +
          ((uVar42 + uVar34 >> 0x20) * 0x1151 << 0x20);
  lVar10 = (uVar44 + uVar35 & 0xffffffff) * 0x1151 + 0x4000 +
           ((uVar44 + uVar35 >> 0x20) * 0x1151 << 0x20);
  lVar5 = (uVar47 + uVar38 & 0xffffffff) * 0x1151 + 0x4000 +
          ((uVar47 + uVar38 >> 0x20) * 0x1151 << 0x20);
  data[0x10] = (DCTELEM)(((uVar39 >> 0x20) * 0x187e << 0x20) + (uVar39 & 0xffffffff) * 0x187e +
                         lVar6 >> 0xf);
  data[0x11] = (DCTELEM)(((uVar42 >> 0x20) * 0x187e << 0x20) + (uVar42 & 0xffffffff) * 0x187e +
                         lVar7 >> 0xf);
  data[0x12] = (DCTELEM)(((uVar44 >> 0x20) * 0x187e << 0x20) + (uVar44 & 0xffffffff) * 0x187e +
                         lVar10 >> 0xf);
  data[0x13] = (DCTELEM)(((uVar47 >> 0x20) * 0x187e << 0x20) + (uVar47 & 0xffffffff) * 0x187e +
                         lVar5 >> 0xf);
  auVar68._4_4_ = iVar67;
  auVar68._0_4_ = uVar64;
  uVar60 = -(uint)((int)uVar64 < 0);
  iVar63 = -(uint)(iVar67 < 0);
  auVar68._8_4_ = iVar67;
  auVar68._12_4_ = iVar63;
  uVar70 = auVar68._8_8_;
  uVar11 = -(uint)((int)uVar59 < 0);
  iVar8 = -(uint)(iVar9 < 0);
  auVar20._8_4_ = iVar9;
  auVar20._12_4_ = iVar8;
  uVar39 = auVar20._8_8_;
  auVar4._8_4_ = uVar26;
  auVar4._0_8_ = CONCAT44(iVar25,uVar19);
  auVar4._12_4_ = iVar27;
  auVar46._0_8_ = auVar4._8_8_;
  uVar12 = -(uint)((int)uVar26 < 0);
  iVar9 = -(uint)(iVar27 < 0);
  local_b8 = CONCAT44(iVar9,uVar12);
  auVar46._8_4_ = iVar27;
  auVar46._12_4_ = iVar9;
  uVar48 = auVar46._8_8_;
  uVar13 = -(uint)((int)uVar19 < 0);
  iVar27 = -(uint)(iVar25 < 0);
  local_a8 = CONCAT44(iVar27,uVar13);
  auVar41._8_4_ = iVar25;
  auVar41._0_8_ = CONCAT44(iVar25,uVar19);
  auVar41._12_4_ = iVar27;
  uVar43 = auVar41._8_8_;
  auVar50._4_4_ = iVar94;
  auVar50._0_4_ = uVar92;
  data[0x30] = (DCTELEM)((uVar32 & 0xffffffff) * 0xffffc4df +
                         ((uVar32 >> 0x20) * 0xffffc4df + (uVar32 & 0xffffffff) * 0x7fff << 0x20) +
                         lVar6 >> 0xf);
  data[0x31] = (DCTELEM)((uVar34 & 0xffffffff) * 0xffffc4df +
                         ((uVar34 >> 0x20) * 0xffffc4df + (uVar34 & 0xffffffff) * 0x7fff << 0x20) +
                         lVar7 >> 0xf);
  data[0x32] = (DCTELEM)((uVar35 & 0xffffffff) * 0xffffc4df +
                         ((uVar35 >> 0x20) * 0xffffc4df + (uVar35 & 0xffffffff) * 0x7fff << 0x20) +
                         lVar10 >> 0xf);
  data[0x33] = (DCTELEM)((uVar38 & 0xffffffff) * 0xffffc4df +
                         ((uVar38 >> 0x20) * 0xffffc4df + (uVar38 & 0xffffffff) * 0x7fff << 0x20) +
                         lVar5 >> 0xf);
  uVar15 = -(uint)((int)uVar92 < 0);
  iVar25 = -(uint)(iVar94 < 0);
  auVar50._8_4_ = iVar94;
  auVar50._12_4_ = iVar25;
  uVar51 = auVar50._8_8_;
  uVar16 = -(uint)((int)uVar88 < 0);
  iVar94 = -(uint)(iVar91 < 0);
  auVar14._8_4_ = iVar91;
  auVar14._12_4_ = iVar94;
  uVar34 = auVar14._8_8_;
  uVar32 = CONCAT44(uVar13,uVar19) + CONCAT44(uVar84,uVar95);
  uVar35 = uVar43 + uVar30;
  uVar72 = CONCAT44(uVar12,uVar26) + CONCAT44(uVar18,uVar29);
  uVar76 = uVar48 + uVar56;
  uVar89 = CONCAT44(uVar16,uVar88) + CONCAT44(uVar11,uVar59);
  uVar93 = uVar34 + uVar39;
  uVar79 = CONCAT44(uVar15,uVar92) + CONCAT44(uVar60,uVar64);
  uVar83 = uVar51 + uVar70;
  lVar10 = (uVar79 + uVar72 & 0xffffffff) * 0x25a1 + 0x4000 +
           ((uVar79 + uVar72 >> 0x20) * 0x25a1 << 0x20);
  lVar5 = (uVar83 + uVar76 & 0xffffffff) * 0x25a1 + 0x4000 +
          ((uVar83 + uVar76 >> 0x20) * 0x25a1 << 0x20);
  lVar36 = (uVar89 + uVar32 & 0xffffffff) * 0x25a1 + 0x4000 +
           ((uVar89 + uVar32 >> 0x20) * 0x25a1 << 0x20);
  lVar78 = (uVar93 + uVar35 & 0xffffffff) * 0x25a1 + 0x4000 +
           ((uVar93 + uVar35 >> 0x20) * 0x25a1 << 0x20);
  uVar44 = CONCAT44(uVar15,uVar92) + CONCAT44(uVar18,uVar29);
  uVar47 = uVar51 + uVar56;
  auVar81._8_4_ = iVar24;
  auVar81._0_8_ = local_d8;
  auVar81._12_4_ = -(uint)(iVar31 < 0);
  uVar52 = CONCAT44(uVar16,uVar88) + CONCAT44(uVar84,uVar95);
  uVar57 = uVar34 + uVar30;
  auVar90._4_4_ = iVar87;
  auVar90._0_4_ = uVar84;
  auVar90._8_4_ = iVar87;
  auVar90._12_4_ = -(uint)(iVar31 < 0);
  uVar38 = CONCAT44(uVar12,uVar26) + CONCAT44(uVar60,uVar64);
  uVar42 = uVar48 + uVar70;
  auVar86._4_4_ = iVar63;
  auVar86._0_4_ = uVar60;
  auVar86._8_4_ = iVar63;
  auVar86._12_4_ = -(uint)(iVar67 < 0);
  uVar61 = CONCAT44(uVar13,uVar19) + CONCAT44(uVar11,uVar59);
  uVar65 = uVar43 + uVar39;
  auVar17._4_4_ = iVar8;
  auVar17._0_4_ = uVar11;
  auVar17._8_4_ = iVar8;
  auVar17._12_4_ = -(uint)(iVar67 < 0);
  auVar21._8_4_ = iVar9;
  auVar21._0_8_ = local_b8;
  auVar21._12_4_ = iVar9;
  auVar22._8_4_ = iVar27;
  auVar22._0_8_ = local_a8;
  auVar22._12_4_ = iVar27;
  auVar23._4_4_ = iVar25;
  auVar23._0_4_ = uVar15;
  auVar23._8_4_ = iVar25;
  auVar23._12_4_ = iVar25;
  auVar69._4_4_ = iVar94;
  auVar69._0_4_ = uVar16;
  auVar69._8_4_ = iVar94;
  auVar69._12_4_ = iVar94;
  lVar71 = (uVar44 & 0xffffffff) * 0xffffe333 +
           ((uVar44 >> 0x20) * 0xffffe333 + (uVar44 & 0xffffffff) * 0xffffffff << 0x20);
  lVar75 = (uVar47 & 0xffffffff) * 0xffffe333 +
           ((uVar47 >> 0x20) * 0xffffe333 + (uVar47 & 0xffffffff) * 0xffffffff << 0x20);
  lVar53 = (uVar52 & 0xffffffff) * 0xffffe333 +
           ((uVar52 >> 0x20) * 0xffffe333 + (uVar52 & 0xffffffff) * 0xffffffff << 0x20);
  lVar58 = (uVar57 & 0xffffffff) * 0xffffe333 +
           ((uVar57 >> 0x20) * 0xffffe333 + (uVar57 & 0xffffffff) * 0xffffffff << 0x20);
  lVar6 = (uVar38 & 0xffffffff) * 0xffffadfd +
          ((uVar38 >> 0x20) * 0xffffadfd + (uVar38 & 0xffffffff) * 0xffffffff << 0x20);
  lVar7 = (uVar42 & 0xffffffff) * 0xffffadfd +
          ((uVar42 >> 0x20) * 0xffffadfd + (uVar42 & 0xffffffff) * 0xffffffff << 0x20);
  lVar62 = (uVar61 & 0xffffffff) * 0xffffadfd +
           ((uVar61 >> 0x20) * 0xffffadfd + (uVar61 & 0xffffffff) * 0xffffffff << 0x20);
  lVar66 = (uVar65 & 0xffffffff) * 0xffffadfd +
           ((uVar65 >> 0x20) * 0xffffadfd + (uVar65 & 0xffffffff) * 0xffffffff << 0x20);
  lVar49 = (uVar32 & 0xffffffff) * 0xfffff384 +
           ((uVar32 >> 0x20) * 0xfffff384 + (uVar32 & 0xffffffff) * 0xffffffff << 0x20) + lVar36;
  lVar82 = (uVar35 & 0xffffffff) * 0xfffff384 +
           ((uVar35 >> 0x20) * 0xfffff384 + (uVar35 & 0xffffffff) * 0xffffffff << 0x20) + lVar78;
  lVar36 = (uVar89 & 0xffffffff) * 0xffffc13b +
           ((uVar89 >> 0x20) * 0xffffc13b + (uVar89 & 0xffffffff) * 0xffffffff << 0x20) + lVar36;
  lVar78 = (uVar93 & 0xffffffff) * 0xffffc13b +
           ((uVar93 >> 0x20) * 0xffffc13b + (uVar93 & 0xffffffff) * 0xffffffff << 0x20) + lVar78;
  lVar73 = (uVar72 & 0xffffffff) * 0xfffff384 +
           ((uVar72 >> 0x20) * 0xfffff384 + (uVar72 & 0xffffffff) * 0xffffffff << 0x20) + lVar10;
  lVar77 = (uVar76 & 0xffffffff) * 0xfffff384 +
           ((uVar76 >> 0x20) * 0xfffff384 + (uVar76 & 0xffffffff) * 0xffffffff << 0x20) + lVar5;
  lVar10 = (uVar79 & 0xffffffff) * 0xffffc13b +
           ((uVar79 >> 0x20) * 0xffffc13b + (uVar79 & 0xffffffff) * 0xffffffff << 0x20) + lVar10;
  lVar5 = (uVar83 & 0xffffffff) * 0xffffc13b +
          ((uVar83 >> 0x20) * 0xffffc13b + (uVar83 & 0xffffffff) * 0xffffffff << 0x20) + lVar5;
  data[8] = (DCTELEM)(((ulong)uVar84 * 0x300b << 0x20) + (ulong)uVar95 * 0x300b + lVar53 + lVar49 >>
                     0xf);
  data[9] = (DCTELEM)(((auVar90._8_8_ & 0xffffffff) * 0x300b << 0x20) +
                      (uVar30 & 0xffffffff) * 0x300b + lVar58 + lVar82 >> 0xf);
  data[10] = (DCTELEM)(((ulong)uVar18 * 0x300b << 0x20) + (ulong)uVar29 * 0x300b + lVar71 + lVar73
                      >> 0xf);
  data[0xb] = (DCTELEM)(((auVar81._8_8_ & 0xffffffff) * 0x300b << 0x20) +
                        (uVar56 & 0xffffffff) * 0x300b + lVar75 + lVar77 >> 0xf);
  data[0x18] = (DCTELEM)(((ulong)uVar11 * 0x6254 << 0x20) + (ulong)uVar59 * 0x6254 + lVar62 + lVar36
                        >> 0xf);
  data[0x19] = (DCTELEM)(((auVar17._8_8_ & 0xffffffff) * 0x6254 << 0x20) +
                         (uVar39 & 0xffffffff) * 0x6254 + lVar66 + lVar78 >> 0xf);
  data[0x1a] = (DCTELEM)(((ulong)uVar60 * 0x6254 << 0x20) + (ulong)uVar64 * 0x6254 + lVar6 + lVar10
                        >> 0xf);
  data[0x1b] = (DCTELEM)(((auVar86._8_8_ & 0xffffffff) * 0x6254 << 0x20) +
                         (uVar70 & 0xffffffff) * 0x6254 + lVar7 + lVar5 >> 0xf);
  data[0x28] = (DCTELEM)(lVar62 + ((ulong)uVar13 * 0x41b3 << 0x20) + (ulong)uVar19 * 0x41b3 + lVar49
                        >> 0xf);
  data[0x29] = (DCTELEM)(lVar66 + ((auVar22._8_8_ & 0xffffffff) * 0x41b3 << 0x20) +
                                  (uVar43 & 0xffffffff) * 0x41b3 + lVar82 >> 0xf);
  data[0x2a] = (DCTELEM)(lVar6 + ((ulong)uVar12 * 0x41b3 << 0x20) + (ulong)uVar26 * 0x41b3 + lVar73
                        >> 0xf);
  data[0x2b] = (DCTELEM)(lVar7 + ((auVar21._8_8_ & 0xffffffff) * 0x41b3 << 0x20) +
                                 (uVar48 & 0xffffffff) * 0x41b3 + lVar77 >> 0xf);
  data[0x38] = (DCTELEM)(lVar53 + ((ulong)uVar16 * 0x98e << 0x20) + (ulong)uVar88 * 0x98e + lVar36
                        >> 0xf);
  data[0x39] = (DCTELEM)(lVar58 + ((auVar69._8_8_ & 0xffffffff) * 0x98e << 0x20) +
                                  (uVar34 & 0xffffffff) * 0x98e + lVar78 >> 0xf);
  data[0x3a] = (DCTELEM)(lVar71 + ((ulong)uVar15 * 0x98e << 0x20) + (ulong)uVar92 * 0x98e + lVar10
                        >> 0xf);
  data[0x3b] = (DCTELEM)(lVar75 + ((auVar23._8_8_ & 0xffffffff) * 0x98e << 0x20) +
                                  (uVar51 & 0xffffffff) * 0x98e + lVar5 >> 0xf);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_4x8 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  INT32 tmp10, tmp11, tmp12, tmp13;
  INT32 z1;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We must also scale the output by 8/4 = 2, which we add here. */
  /* 4-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16). */

  dataptr = data;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[3]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[2]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[3]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[2]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 - 4 * CENTERJSAMPLE) << (PASS1_BITS+1));
    dataptr[2] = (DCTELEM) ((tmp0 - tmp1) << (PASS1_BITS+1));

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-PASS1_BITS-2);

    dataptr[1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS-PASS1_BITS-1);
    dataptr[3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS-PASS1_BITS-1);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];

    /* Add fudge factor here for final descale. */
    tmp10 = tmp0 + tmp3 + (ONE << (PASS1_BITS-1));
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    dataptr[DCTSIZE*0] = (DCTELEM) RIGHT_SHIFT(tmp10 + tmp11, PASS1_BITS);
    dataptr[DCTSIZE*4] = (DCTELEM) RIGHT_SHIFT(tmp10 - tmp11, PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS+PASS1_BITS-1);
    dataptr[DCTSIZE*2] = (DCTELEM)
      RIGHT_SHIFT(z1 + MULTIPLY(tmp12, FIX_0_765366865), CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*6] = (DCTELEM)
      RIGHT_SHIFT(z1 - MULTIPLY(tmp13, FIX_1_847759065), CONST_BITS+PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * 8-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS+PASS1_BITS-1);

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[DCTSIZE*1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + tmp10 + tmp12, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      RIGHT_SHIFT(tmp1 + tmp11 + tmp13, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*5] = (DCTELEM)
      RIGHT_SHIFT(tmp2 + tmp11 + tmp12, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*7] = (DCTELEM)
      RIGHT_SHIFT(tmp3 + tmp10 + tmp13, CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}